

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mems.cpp
# Opt level: O0

void __thiscall Mems::compare_by_x_m(Mems *this)

{
  iterator __first;
  iterator __last;
  Mems *this_local;
  
  __first = std::vector<Mirror,_std::allocator<Mirror>_>::begin(&this->_mems_mirrors);
  __last = std::vector<Mirror,_std::allocator<Mirror>_>::end(&this->_mems_mirrors);
  std::
  sort<__gnu_cxx::__normal_iterator<Mirror*,std::vector<Mirror,std::allocator<Mirror>>>,bool(*)(Mirror_const&,Mirror_const&)>
            ((__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>)
             __first._M_current,
             (__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>)
             __last._M_current,compare_by_x);
  return;
}

Assistant:

void Mems::compare_by_x_m(){
  std::sort(_mems_mirrors.begin(), _mems_mirrors.end(), compare_by_x);
}